

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumMethods.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::EnumNameMethod::~EnumNameMethod(EnumNameMethod *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~EnumNameMethod((EnumNameMethod *)0x936b18);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

explicit EnumNameMethod(const Builtins& builtins) :
        SimpleSystemSubroutine(KnownSystemName::Name, SubroutineKind::Function, 0, {},
                               builtins.stringType, true) {}